

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masterserver.cpp
# Opt level: O0

int __thiscall CMasterServer::Save(CMasterServer *this)

{
  char *string;
  NETADDR *in_RDI;
  long in_FS_OFFSET;
  int i;
  IOHANDLE File;
  char aBuf [256];
  char aAddrStr [48];
  void *buffer;
  IOHANDLE io;
  int in_stack_fffffffffffffea8;
  int max_length;
  NETADDR *addr;
  int local_13c;
  char local_138 [96];
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI[0x3d].ip + 4) == 0) {
    local_13c = -1;
  }
  else {
    buffer = (void *)0x0;
    io = (IOHANDLE)0x0;
    addr = in_RDI;
    string = (char *)(**(code **)(**(long **)(in_RDI[0x3d].ip + 4) + 0x20))
                               (*(long **)(in_RDI[0x3d].ip + 4),"masters.cfg",2,0,0);
    if (string == (char *)0x0) {
      local_13c = -1;
    }
    else {
      for (max_length = 0; max_length < 4; max_length = max_length + 1) {
        if (in_RDI[(long)max_length * 0xf + 6].type == 0) {
          local_38[0] = 0;
        }
        else {
          net_addr_str(addr,string,max_length,in_stack_fffffffffffffea8);
        }
        str_format(local_138,0x100,"%s %s",in_RDI[(long)max_length * 0xf].ip + 0xc,local_38);
        str_length((char *)0x23fdb0);
        io_write(io,buffer,0);
        io_write_newline((IOHANDLE)0x23fdcb);
      }
      io_close((IOHANDLE)0x23fde5);
      local_13c = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_13c;
  }
  __stack_chk_fail();
}

Assistant:

virtual int Save()
	{
		if(!m_pStorage)
			return -1;

		// try to open file
		IOHANDLE File = m_pStorage->OpenFile("masters.cfg", IOFLAG_WRITE, IStorage::TYPE_SAVE);
		if(!File)
			return -1;

		for(int i = 0; i < MAX_MASTERSERVERS; i++)
		{
			char aAddrStr[NETADDR_MAXSTRSIZE];
			if(m_aMasterServers[i].m_Addr.type != NETTYPE_INVALID)
				net_addr_str(&m_aMasterServers[i].m_Addr, aAddrStr, sizeof(aAddrStr), true);
			else
				aAddrStr[0] = 0;
			char aBuf[256];
			str_format(aBuf, sizeof(aBuf), "%s %s", m_aMasterServers[i].m_aHostname, aAddrStr);
			io_write(File, aBuf, str_length(aBuf));
			io_write_newline(File);
		}

		io_close(File);
		return 0;
	}